

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::MacroExpansion::append
          (MacroExpansion *this,Token token,SourceLocation location,bool allowLineContinuation)

{
  string_view rawText;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  string_view rawText_00;
  Info *in_RDX;
  EVP_PKEY_CTX *src;
  undefined8 in_RSI;
  char *in_RDI;
  byte in_R8B;
  Token TVar1;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  SmallVector<slang::parsing::Trivia,_8UL> newTrivia;
  Token *in_stack_fffffffffffffdc8;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffffdd0;
  span<slang::parsing::Trivia,_18446744073709551615UL> *in_stack_fffffffffffffdd8;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  Token *in_stack_fffffffffffffdf0;
  BumpAllocator *in_stack_fffffffffffffe00;
  Token *in_stack_fffffffffffffe08;
  SourceLocation in_stack_fffffffffffffe10;
  pointer in_stack_fffffffffffffe18;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe40;
  Token *local_190;
  SmallVectorBase<slang::parsing::Token> *pSStack_188;
  SmallVectorBase<slang::parsing::Trivia> local_100 [4];
  Token local_58;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_48;
  Token local_38;
  byte local_21;
  undefined8 local_10;
  Info *local_8;
  
  local_21 = in_R8B & 1;
  local_10 = in_RSI;
  local_8 = in_RDX;
  if ((in_RDI[0x28] & 1U) == 0) {
    if ((in_RDI[0x29] & 1U) == 0) {
      in_stack_fffffffffffffe40 = *(size_t *)(in_RDI + 8);
      local_48 = Token::trivia(in_stack_fffffffffffffdf0);
      trivia._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
      trivia._M_ptr = in_stack_fffffffffffffe18;
      TVar1 = Token::withTrivia((Token *)in_stack_fffffffffffffe10,
                                (BumpAllocator *)in_stack_fffffffffffffe08,trivia);
      local_38._0_8_ = TVar1._0_8_;
      local_10._0_2_ = local_38.kind;
      local_10._2_1_ = local_38._2_1_;
      local_10._3_1_ = local_38.numFlags.raw;
      local_10._4_4_ = local_38.rawLen;
      local_38.info = TVar1.info;
      local_8 = local_38.info;
      local_38 = TVar1;
    }
    else {
      std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span
                ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)0x381d17);
      sVar2._M_extent._M_extent_value = in_stack_fffffffffffffe20._M_extent_value;
      sVar2._M_ptr = in_stack_fffffffffffffe18;
      TVar1 = Token::withTrivia((Token *)in_stack_fffffffffffffe10,
                                (BumpAllocator *)in_stack_fffffffffffffe08,sVar2);
      local_58._0_8_ = TVar1._0_8_;
      local_10._0_2_ = local_58.kind;
      local_10._2_1_ = local_58._2_1_;
      local_10._3_1_ = local_58.numFlags.raw;
      local_10._4_4_ = local_58.rawLen;
      local_58.info = TVar1.info;
      local_8 = local_58.info;
      local_58 = TVar1;
    }
    in_RDI[0x28] = '\x01';
  }
  if (((short)local_10 == 0x15f) && ((local_21 & 1) == 0)) {
    SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
              ((SmallVector<slang::parsing::Trivia,_8UL> *)0x381da0);
    sVar2 = Token::trivia(in_stack_fffffffffffffdf0);
    SmallVectorBase<slang::parsing::Trivia>::
    append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
              (in_stack_fffffffffffffde0,
               (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
               in_stack_fffffffffffffdd8);
    sVar3 = Token::rawText((Token *)in_stack_fffffffffffffde0);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdf0
                       ,in_stack_fffffffffffffde8,(size_type)in_stack_fffffffffffffde0);
    rawText._M_str = (char *)in_stack_fffffffffffffde0;
    rawText._M_len = (size_t)in_stack_fffffffffffffdd8;
    Trivia::Trivia((Trivia *)in_stack_fffffffffffffdd0,
                   (TriviaKind)((ulong)in_stack_fffffffffffffdc8 >> 0x38),rawText);
    SmallVectorBase<slang::parsing::Trivia>::push_back
              ((SmallVectorBase<slang::parsing::Trivia> *)in_stack_fffffffffffffdd0,
               (Trivia *)in_stack_fffffffffffffdc8);
    SmallVectorBase<slang::parsing::Trivia>::copy(local_100,*(EVP_PKEY_CTX **)(in_RDI + 8),src);
    std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
    span<slang::parsing::Trivia,_18446744073709551615UL>
              ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0,
               (char *)in_stack_fffffffffffffdd8);
    trivia_00._M_extent._M_extent_value = (size_t)sVar2._M_ptr;
    trivia_00._M_ptr = (pointer)sVar2._M_extent._M_extent_value._M_extent_value;
    rawText_00._M_str = in_RDI;
    rawText_00._M_len = in_stack_fffffffffffffe40;
    Token::Token((Token *)sVar3._M_str,(BumpAllocator *)bVar4._M_len,bVar4._M_str._6_2_,trivia_00,
                 rawText_00,(SourceLocation)sVar3._M_len);
    SmallVectorBase<slang::parsing::Token>::push_back(pSStack_188,local_190);
    SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
              ((SmallVector<slang::parsing::Trivia,_8UL> *)0x381f7d);
  }
  else {
    Token::withLocation(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffe10);
    SmallVectorBase<slang::parsing::Token>::push_back
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  return;
}

Assistant:

void Preprocessor::MacroExpansion::append(Token token, SourceLocation location,
                                          bool allowLineContinuation) {
    if (!any) {
        if (!isTopLevel)
            token = token.withTrivia(alloc, usageSite.trivia());
        else
            token = token.withTrivia(alloc, {});
        any = true;
    }

    // Line continuations get stripped out when we expand macros and become newline trivia instead.
    if (token.kind == TokenKind::LineContinuation && !allowLineContinuation) {
        SmallVector<Trivia, 8> newTrivia;
        newTrivia.append_range(token.trivia());
        newTrivia.push_back(Trivia(TriviaKind::EndOfLine, token.rawText().substr(1)));

        dest.push_back(
            Token(alloc, TokenKind::EmptyMacroArgument, newTrivia.copy(alloc), "", location));
    }
    else {
        dest.push_back(token.withLocation(alloc, location));
    }
}